

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall sznet::net::Channel::handleEventWithGuard(Channel *this,Timestamp receiveTime)

{
  uint uVar1;
  self *psVar2;
  LogStream *pLVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_1040;
  undefined1 local_70 [12];
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  string local_40;
  
  this->m_eventHandling = true;
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<98>
              ((SourceFile *)local_70,
               (char (*) [98])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_70._0_8_;
    file.m_size = local_70._8_4_;
    Logger::Logger(&local_1040,file,0x4c,TRACE,"handleEventWithGuard");
    reventsToString_abi_cxx11_(&local_40,this);
    LogStream::operator<<(&local_1040.m_impl.m_stream,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Logger::~Logger(&local_1040);
  }
  if ((this->m_revents & 0x21) == 0x20) {
    if (this->m_logHup == true) {
      Logger::SourceFile::SourceFile<98>
                ((SourceFile *)local_60,
                 (char (*) [98])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_60._0_8_;
      file_00.m_size = local_60._8_4_;
      Logger::Logger(&local_1040,file_00,0x52,WARN);
      psVar2 = LogStream::operator<<(&local_1040.m_impl.m_stream,"fd = ");
      pLVar3 = LogStream::operator<<(psVar2,this->m_fd);
      LogStream::operator<<(pLVar3," Channel::handle_event() kHupEvent");
      Logger::~Logger(&local_1040);
    }
    if ((this->m_closeCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&this->m_closeCallback);
    }
  }
  uVar1 = this->m_revents;
  if ((uVar1 & 0x40) != 0) {
    Logger::SourceFile::SourceFile<98>
              ((SourceFile *)local_50,
               (char (*) [98])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)local_50._0_8_;
    file_01.m_size = local_50._8_4_;
    Logger::Logger(&local_1040,file_01,0x5e,WARN);
    psVar2 = LogStream::operator<<(&local_1040.m_impl.m_stream,"fd = ");
    pLVar3 = LogStream::operator<<(psVar2,this->m_fd);
    LogStream::operator<<(pLVar3," Channel::handle_event() KNvalEvent");
    Logger::~Logger(&local_1040);
    uVar1 = this->m_revents;
  }
  if (((uVar1 & 0x50) != 0) &&
     ((this->m_errorCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->m_errorCallback);
    uVar1 = this->m_revents;
  }
  if (((uVar1 & 7) != 0) &&
     ((this->m_readCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(sznet::Timestamp)>::operator()(&this->m_readCallback,receiveTime);
    uVar1 = this->m_revents;
  }
  if (((uVar1 & 8) != 0) &&
     ((this->m_writeCallback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->m_writeCallback);
  }
  this->m_eventHandling = false;
  return;
}

Assistant:

void Channel::handleEventWithGuard(Timestamp receiveTime)
{
	// 事件处理时，设置下此状态
	// Channel析构时，用到此状态 
	m_eventHandling = true;
	LOG_TRACE << reventsToString();
	// RCV_SHUTDOWN | SEND_SHUTDOWN
	if ((m_revents & kHupEvent) && !(m_revents & kReadEvent))
	{
		if (m_logHup)
		{
			LOG_WARN << "fd = " << m_fd << " Channel::handle_event() kHupEvent";
		}
		if (m_closeCallback)
		{
			m_closeCallback();
		}
	}

	// A POLLNVAL means the socket file descriptor is not open. 
	// It would be an error to close() it.
	if (m_revents & kNvalEvent)
	{
		LOG_WARN << "fd = " << m_fd << " Channel::handle_event() KNvalEvent";
	}

	// A POLLERR means error condition happened on the associated file descriptor.
	if (m_revents & (kErrorEvent | kNvalEvent))
	{
		if (m_errorCallback)
		{
			m_errorCallback();
		}
	}

	// 读事件
	if (m_revents & (kReadEvent | kPriEvent | kRdHupEvent))
	{
		if (m_readCallback)
		{
			m_readCallback(receiveTime);
		}
	}

	// 写事件
	if (m_revents & kWriteEvent)
	{
		if (m_writeCallback)
		{
			m_writeCallback();
		}
	}

	m_eventHandling = false;
}